

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

void fast_forward_first_char2
               (compiler_common *common,PCRE2_UCHAR16 char1,PCRE2_UCHAR16 char2,sljit_s32 offset)

{
  int iVar1;
  sljit_compiler *psVar2;
  sljit_compiler *compiler;
  compiler_common *pcVar3;
  undefined1 uVar4;
  sljit_s32 value;
  uint uVar5;
  sljit_jump *psVar6;
  sljit_label *psVar7;
  sljit_sw sVar8;
  long lVar9;
  uint local_78;
  undefined4 local_70;
  undefined1 local_6c;
  long local_68;
  sljit_compiler *local_60;
  compiler_common *local_58;
  sljit_jump *local_50;
  sljit_jump *local_48;
  sljit_jump *local_40;
  ulong local_38;
  
  psVar2 = common->compiler;
  iVar1 = common->match_end_ptr;
  lVar9 = (long)iVar1;
  if (lVar9 != 0) {
    sljit_emit_op1(psVar2,0x20,1,0,0x8e,lVar9);
  }
  if (0 < offset) {
    sljit_emit_op2(psVar2,0x60,2,0,2,0,0x40,(ulong)(uint)(offset * 2));
  }
  local_68 = lVar9;
  local_58 = common;
  if (iVar1 != 0) {
    sljit_emit_op1(psVar2,0x20,3,0,0xd,0);
    sljit_emit_op2(psVar2,0x60,1,0,1,0,0x40,(ulong)(offset * 2 + 2));
    sVar8 = 0xd;
    sljit_emit_op2(psVar2,0x1062,0,0,0xd,0,1,0);
    common = local_58;
    sljit_emit_cmov(psVar2,4,0xd,1,sVar8);
  }
  compiler = common->compiler;
  local_78 = 0;
  if (char1 != char2) {
    uVar5 = (uint)(char2 ^ char1);
    local_78 = 0;
    if ((uVar5 & uVar5 - 1) == 0) {
      local_78 = uVar5;
    }
  }
  local_38 = (ulong)(uint)offset;
  psVar6 = sljit_emit_cmp(compiler,3,2,0,0xd,0);
  if (common->mode == 1) {
    add_jump(compiler,&common->failed_match,psVar6);
  }
  sljit_emit_op1(compiler,0x20,1,0,0x40,(long)((ulong)(local_78 | char1) * 0x1000100000000) >> 0x20)
  ;
  local_70 = 0xd06e0f66;
  sljit_emit_op_custom(compiler,&local_70,4);
  local_60 = psVar2;
  local_48 = psVar6;
  if (char1 == char2) {
    sljit_emit_op1(compiler,0x20,4,0,2,0);
    local_70._0_3_ = CONCAT12(0x70,(undefined2)local_70);
    local_70 = (uint)(uint3)local_70;
    local_6c = 0;
    uVar4 = 0xd2;
  }
  else {
    uVar5 = local_78;
    if (local_78 == 0) {
      uVar5 = (uint)char2;
    }
    sljit_emit_op1(compiler,0x20,1,0,0x40,(long)(int)(uVar5 * 0x10001));
    local_70 = CONCAT13(0xd8,(uint3)local_70);
    sljit_emit_op_custom(compiler,&local_70,4);
    sljit_emit_op1(compiler,0x20,4,0,2,0);
    local_70 = CONCAT22(0xd270,(undefined2)local_70);
    local_6c = 0;
    sljit_emit_op_custom(compiler,&local_70,5);
    uVar4 = 0xdb;
  }
  local_70 = CONCAT13(uVar4,(uint3)local_70);
  sljit_emit_op_custom(compiler,&local_70,5);
  sljit_emit_op2(compiler,0x65,2,0,2,0,0x40,-0x10);
  sljit_emit_op2(compiler,0x65,4,0,4,0,0x40,0xf);
  load_from_mem_sse2(compiler,0,6);
  fast_forward_char_pair_sse2_compare(compiler,char1,char2,local_78,0,2,3,1);
  local_70._2_2_ = 0xc0d7;
  sljit_emit_op_custom(compiler,&local_70,4);
  sljit_emit_op2(compiler,0x60,2,0,2,0,4,0);
  sljit_emit_op2(compiler,0x69,1,0,1,0,4,0);
  local_70 = CONCAT13(local_70._3_1_,0xc0bc0f);
  sljit_emit_op_custom(compiler,&local_70,3);
  local_40 = sljit_emit_jump(compiler,1);
  sljit_emit_op2(compiler,0x62,2,0,2,0,4,0);
  psVar7 = sljit_emit_label(compiler);
  sljit_emit_op2(compiler,0x60,2,0,2,0,0x40,0x10);
  local_50 = sljit_emit_cmp(compiler,3,2,0,0xd,0);
  pcVar3 = local_58;
  if (local_58->mode == 1) {
    add_jump(compiler,&local_58->failed_match,local_50);
  }
  load_from_mem_sse2(compiler,0,6);
  fast_forward_char_pair_sse2_compare(compiler,char1,char2,local_78,0,2,3,1);
  local_70 = 0xc0d70f66;
  sljit_emit_op_custom(compiler,&local_70,4);
  local_70 = CONCAT13(local_70._3_1_,0xc0bc0f);
  sljit_emit_op_custom(compiler,&local_70,3);
  psVar6 = sljit_emit_jump(compiler,0);
  sljit_set_label(psVar6,psVar7);
  psVar7 = sljit_emit_label(compiler);
  sljit_set_label(local_40,psVar7);
  sljit_emit_op2(compiler,0x60,2,0,2,0,1,0);
  if (pcVar3->mode == 1) {
    psVar6 = sljit_emit_cmp(compiler,3,2,0,0xd,0);
    add_jump(compiler,&pcVar3->failed_match,psVar6);
  }
  else {
    psVar7 = sljit_emit_label(compiler);
    sljit_set_label(local_48,psVar7);
    psVar7 = sljit_emit_label(compiler);
    sljit_set_label(local_50,psVar7);
    sVar8 = 2;
    sljit_emit_op2(compiler,0x1062,0,0,2,0,0xd,0);
    sljit_emit_cmov(compiler,4,2,0xd,sVar8);
  }
  psVar2 = local_60;
  lVar9 = local_68;
  if (0 < (int)local_38) {
    sljit_emit_op2(local_60,0x62,2,0,2,0,0x40,(ulong)(uint)((int)local_38 * 2));
  }
  if ((int)lVar9 == 0) {
    return;
  }
  sljit_emit_op1(psVar2,0x20,0xd,0,3,0);
  return;
}

Assistant:

static void fast_forward_first_char2(compiler_common *common, PCRE2_UCHAR char1, PCRE2_UCHAR char2, sljit_s32 offset)
{
DEFINE_COMPILER;
struct sljit_label *start;
struct sljit_jump *match;
struct sljit_jump *partial_quit;
PCRE2_UCHAR mask;
BOOL has_match_end = (common->match_end_ptr != 0);

SLJIT_ASSERT(common->mode == PCRE2_JIT_COMPLETE || offset == 0);

if (has_match_end)
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->match_end_ptr);

if (offset > 0)
  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(offset));

if (has_match_end)
  {
  OP1(SLJIT_MOV, TMP3, 0, STR_END, 0);

  OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, IN_UCHARS(offset + 1));
  OP2(SLJIT_SUB | SLJIT_SET_GREATER, SLJIT_UNUSED, 0, STR_END, 0, TMP1, 0);
  CMOV(SLJIT_GREATER, STR_END, TMP1, 0);
  }

#if (defined SLJIT_CONFIG_X86 && SLJIT_CONFIG_X86) && !(defined SUPPORT_VALGRIND)

/* SSE2 accelerated first character search. */

if (sljit_has_cpu_feature(SLJIT_HAS_SSE2))
  {
  fast_forward_first_char2_sse2(common, char1, char2, offset);

  if (offset > 0)
    OP2(SLJIT_SUB, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(offset));

  if (has_match_end)
    OP1(SLJIT_MOV, STR_END, 0, TMP3, 0);
  return;
  }

#endif

start = LABEL();

partial_quit = CMP(SLJIT_GREATER_EQUAL, STR_PTR, 0, STR_END, 0);
if (common->mode == PCRE2_JIT_COMPLETE)
  add_jump(compiler, &common->failed_match, partial_quit);

OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));

if (char1 == char2)
  CMPTO(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, char1, start);
else
  {
  mask = char1 ^ char2;
  if (is_powerof2(mask))
    {
    OP2(SLJIT_OR, TMP1, 0, TMP1, 0, SLJIT_IMM, mask);
    CMPTO(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, char1 | mask, start);
    }
  else
    {
    match = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, char1);
    CMPTO(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, char2, start);
    JUMPHERE(match);
    }
  }

#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH != 32
if (common->utf && offset > 0)
  {
  OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), IN_UCHARS(-(offset + 1)));
  jumpto_if_not_utf_char_start(compiler, TMP1, start);
  }
#endif

OP2(SLJIT_SUB, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(offset + 1));

if (common->mode != PCRE2_JIT_COMPLETE)
  JUMPHERE(partial_quit);

if (has_match_end)
  OP1(SLJIT_MOV, STR_END, 0, TMP3, 0);
}